

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

int Parser_xmlNamespace(Parser *xmlParser,IXML_Node *newNode)

{
  IXML_ElementStack *pIVar1;
  IXML_Node *pIVar2;
  char *__s2;
  IXML_NamespaceURI *pIVar3;
  IXML_NamespaceURI *pIVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  IXML_NamespaceURI *pIVar8;
  char *pcVar9;
  _IXML_NamespaceURI **pp_Var10;
  IXML_ElementStack *pCur;
  
  pcVar9 = newNode->nodeName;
  if (pcVar9 == (char *)0x0) {
    __assert_fail("newNode->nodeName != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                  ,0x6f0,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
  }
  pIVar1 = xmlParser->pCurElement;
  iVar5 = strcmp(pcVar9,"xmlns");
  if (iVar5 == 0) {
    if (pIVar1->namespaceUri != (char *)0x0) {
      free(pIVar1->namespaceUri);
    }
    pcVar9 = safe_strdup(newNode->nodeValue);
    pIVar1->namespaceUri = pcVar9;
    if (pcVar9 != (char *)0x0) goto LAB_00128395;
    iVar5 = 0x6fa;
LAB_00128441:
    uVar6 = 0x66;
  }
  else {
    iVar5 = strncmp(pcVar9,"xmlns:",6);
    if (iVar5 == 0) {
      uVar6 = Parser_setNodePrefixAndLocalName(newNode);
      if (uVar6 != 0) {
        iVar5 = 0x702;
        goto LAB_001284e2;
      }
      pcVar9 = newNode->localName;
      if (pcVar9 == (char *)0x0) {
        __assert_fail("newNode->localName != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                      ,0x706,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
      }
      if (pIVar1 != (IXML_ElementStack *)0x0) {
        if ((pIVar1->prefix == (char *)0x0) || (iVar5 = strcmp(pIVar1->prefix,pcVar9), iVar5 != 0))
        {
          pIVar8 = pIVar1->pNsURI;
          pIVar4 = pIVar1->pNsURI;
          while (pIVar3 = pIVar8, pIVar3 != (IXML_NamespaceURI *)0x0) {
            if ((pIVar3->prefix != (char *)0x0) &&
               (iVar5 = strcmp(pIVar3->prefix,pcVar9), iVar5 == 0)) {
              if (pIVar3->nsURI != (char *)0x0) {
                free(pIVar3->nsURI);
              }
              pcVar9 = safe_strdup(newNode->nodeValue);
              pIVar3->nsURI = pcVar9;
              if (pcVar9 != (char *)0x0) goto LAB_00128395;
              iVar5 = 0x74d;
              goto LAB_00128441;
            }
            pIVar4 = pIVar3;
            pIVar8 = pIVar3->nextNsURI;
          }
          pIVar8 = (IXML_NamespaceURI *)malloc(0x18);
          uVar6 = 0x66;
          if (pIVar8 == (IXML_NamespaceURI *)0x0) {
            iVar5 = 0x72c;
            goto LAB_001284e2;
          }
          pIVar8->nsURI = (char *)0x0;
          pIVar8->prefix = (char *)0x0;
          pIVar8->nextNsURI = (_IXML_NamespaceURI *)0x0;
          pcVar9 = safe_strdup(pcVar9);
          pIVar8->prefix = pcVar9;
          if (pcVar9 == (char *)0x0) {
            free(pIVar8);
            iVar5 = 0x735;
            goto LAB_001284e2;
          }
          pcVar9 = safe_strdup(newNode->nodeValue);
          pIVar8->nsURI = pcVar9;
          if (pcVar9 == (char *)0x0) {
            Parser_freeNsURI(pIVar8);
            free(pIVar8);
            iVar5 = 0x73d;
            goto LAB_001284e2;
          }
          pp_Var10 = &pIVar4->nextNsURI;
          if (pIVar1->pNsURI == (IXML_NamespaceURI *)0x0) {
            pp_Var10 = &pIVar1->pNsURI;
          }
          *pp_Var10 = pIVar8;
        }
        else {
          if (pIVar1->namespaceUri != (char *)0x0) {
            free(pIVar1->namespaceUri);
          }
          pcVar9 = safe_strdup(newNode->nodeValue);
          pIVar1->namespaceUri = pcVar9;
          if (pcVar9 == (char *)0x0) {
            iVar5 = 0x715;
            goto LAB_00128441;
          }
        }
        goto LAB_00128395;
      }
      iVar5 = 0x70a;
    }
    else {
LAB_00128395:
      pIVar2 = xmlParser->pNeedPrefixNode;
      uVar6 = 0;
      if (pIVar2 == (IXML_Node *)0x0) {
        iVar5 = 0;
        goto LAB_001284e2;
      }
      pIVar1 = xmlParser->pCurElement;
      pcVar9 = pIVar2->prefix;
      if (pcVar9 == (char *)0x0) {
        iVar7 = strcmp(pIVar2->nodeName,pIVar1->element);
        iVar5 = 0x755;
        if (iVar7 == 0) {
          if (pIVar1->namespaceUri != (char *)0x0) {
            if (pIVar2->namespaceURI != (char *)0x0) {
              __assert_fail("pNode->namespaceURI == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                            ,0x6c8,"int Parser_addNamespace(Parser *)");
            }
            pcVar9 = strdup(pIVar1->namespaceUri);
            pIVar2->namespaceURI = pcVar9;
            iVar5 = 0x755;
            if (pcVar9 == (char *)0x0) goto LAB_00128441;
          }
          iVar5 = 0x755;
          xmlParser->pNeedPrefixNode = (IXML_Node *)0x0;
          goto LAB_001284e2;
        }
      }
      else {
        __s2 = pIVar1->prefix;
        iVar5 = 0x755;
        if (__s2 != (char *)0x0) {
          iVar5 = strcmp(pIVar2->nodeName,pIVar1->element);
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar9,__s2), iVar5 == 0)) {
            uVar6 = 0;
            if (pIVar1->namespaceUri != (char *)0x0) {
              pcVar9 = strdup(pIVar1->namespaceUri);
              pIVar2->namespaceURI = pcVar9;
              if (pcVar9 == (char *)0x0) {
                uVar6 = 0x66;
              }
              else {
                xmlParser->pNeedPrefixNode = (IXML_Node *)0x0;
                uVar6 = 0;
              }
            }
          }
          else {
            uVar6 = 0x6a;
          }
          iVar5 = 0x755;
          goto LAB_001284e2;
        }
      }
    }
    uVar6 = 0x6a;
  }
LAB_001284e2:
  if ((uVar6 != 0) && (uVar6 != 0x68)) {
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,iVar5,"Parser_xmlNamespace","Error %d\n",(ulong)uVar6);
  }
  return uVar6;
}

Assistant:

static int Parser_xmlNamespace(
	/*! [in] The XML parser. */
	Parser *xmlParser,
	/*! [in] The Node to process. */
	IXML_Node *newNode)
{
	IXML_ElementStack *pCur = xmlParser->pCurElement;
	IXML_NamespaceURI *pNewNs = NULL;
	IXML_NamespaceURI *pNs = NULL;
	IXML_NamespaceURI *pPrevNs = NULL;
	int ret = IXML_SUCCESS;
	int line = 0;

	/* if the newNode contains a namespace definition */
	assert(newNode->nodeName != NULL);

	if (strcmp(newNode->nodeName, "xmlns") == 0) {
		/* default namespace def. */
		if (pCur->namespaceUri != NULL) {
			free(pCur->namespaceUri);
		}
		pCur->namespaceUri = safe_strdup(newNode->nodeValue);
		if (pCur->namespaceUri == NULL) {
			ret = IXML_INSUFFICIENT_MEMORY;
			line = __LINE__;
			goto ExitFunction;
		}
	} else if (strncmp(newNode->nodeName, "xmlns:", strlen("xmlns:")) ==
		   0) {
		/* namespace definition */
		ret = Parser_setNodePrefixAndLocalName(newNode);
		if (ret != IXML_SUCCESS) {
			line = __LINE__;
			goto ExitFunction;
		}

		assert(newNode->localName != NULL);

		if (pCur == NULL) {
			ret = IXML_FAILED;
			line = __LINE__;
			goto ExitFunction;
		}
		if (pCur->prefix != NULL &&
			strcmp(pCur->prefix, newNode->localName) == 0) {
			if (pCur->namespaceUri != NULL) {
				free(pCur->namespaceUri);
			}
			pCur->namespaceUri = safe_strdup(newNode->nodeValue);
			if (pCur->namespaceUri == NULL) {
				ret = IXML_INSUFFICIENT_MEMORY;
				line = __LINE__;
				goto ExitFunction;
			}
		} else {
			pPrevNs = pCur->pNsURI;
			pNs = pPrevNs;
			while (pNs != NULL) {
				if (pNs->prefix != NULL &&
					strcmp(pNs->prefix,
						newNode->localName) == 0) {
					/* replace namespace definition */
					break;
				} else {
					pPrevNs = pNs;
					pNs = pNs->nextNsURI;
				}
			}
			if (pNs == NULL) {
				/* a new definition */
				pNewNs = (IXML_NamespaceURI *)malloc(
					sizeof(IXML_NamespaceURI));
				if (pNewNs == NULL) {
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				memset(pNewNs, 0, sizeof(IXML_NamespaceURI));
				pNewNs->prefix =
					safe_strdup(newNode->localName);
				if (pNewNs->prefix == NULL) {
					free(pNewNs);
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				pNewNs->nsURI = safe_strdup(newNode->nodeValue);
				if (pNewNs->nsURI == NULL) {
					Parser_freeNsURI(pNewNs);
					free(pNewNs);
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				if (pCur->pNsURI == NULL) {
					pCur->pNsURI = pNewNs;
				} else {
					pPrevNs->nextNsURI = pNewNs;
				}
			} else {
				/* udpate the namespace */
				if (pNs->nsURI != NULL) {
					free(pNs->nsURI);
				}
				pNs->nsURI = safe_strdup(newNode->nodeValue);
				if (pNs->nsURI == NULL) {
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
			}
		}
	}
	if (xmlParser->pNeedPrefixNode != NULL) {
		ret = Parser_addNamespace(xmlParser);
		line = __LINE__;
		goto ExitFunction;
	}

ExitFunction:
	if (ret != IXML_SUCCESS && ret != IXML_FILE_DONE) {
		IxmlPrintf(__FILE__,
			line,
			"Parser_xmlNamespace",
			"Error %d\n",
			ret);
	}

	return ret;
}